

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::FatalConditionHandler::handleSignal(int sig)

{
  SignalDefs *def;
  size_t i;
  allocator local_31;
  undefined1 local_30 [8];
  string name;
  int sig_local;
  
  name.field_2._12_4_ = sig;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"<unknown signal>",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  def = (SignalDefs *)0x0;
  do {
    if ((SignalDefs *)0x5 < def) {
LAB_0014062a:
      reset();
      reportFatal((string *)local_30);
      raise(name.field_2._12_4_);
      std::__cxx11::string::~string((string *)local_30);
      return;
    }
    if (name.field_2._12_4_ == *(int *)(signalDefs + (long)def * 0x10)) {
      std::__cxx11::string::operator=
                ((string *)local_30,*(char **)(signalDefs + (long)def * 0x10 + 8));
      goto LAB_0014062a;
    }
    def = (SignalDefs *)((long)&def->id + 1);
  } while( true );
}

Assistant:

static void handleSignal( int sig ) {
            std::string name = "<unknown signal>";
            for (std::size_t i = 0; i < sizeof(signalDefs) / sizeof(SignalDefs); ++i) {
                SignalDefs &def = signalDefs[i];
                if (sig == def.id) {
                    name = def.name;
                    break;
                }
            }
            reset();
            reportFatal(name);
            raise( sig );
        }